

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsHEx<ImPlot::GetterBarH<int>,double>
               (char *label_id,GetterBarH<int> *getter,double height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  ImPlotPlot *pIVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar16;
  int iVar17;
  int iVar18;
  ImPlotRange *pIVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ImPlotRange IVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  ImVec2 b;
  ImVec2 a;
  byte local_5c;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar15 = BeginItem(label_id,1);
  pIVar14 = GImPlot;
  if (bVar15) {
    dVar31 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar16 = getter->Count, 0 < iVar16)) {
      piVar7 = getter->Xs;
      iVar18 = getter->Offset;
      iVar2 = getter->Stride;
      dVar23 = getter->YShift;
      pIVar8 = GImPlot->CurrentPlot;
      iVar3 = pIVar8->CurrentYAxis;
      uVar4 = (pIVar8->XAxis).Flags;
      pIVar19 = GImPlot->ExtentsY + iVar3;
      uVar5 = pIVar8->YAxis[iVar3].Flags;
      iVar17 = 0;
      dVar24 = 0.0;
      do {
        iVar6 = *(int *)((long)piVar7 +
                        (long)(((iVar18 + iVar17) % iVar16 + iVar16) % iVar16) * (long)iVar2);
        dVar25 = dVar23 + dVar24;
        dVar11 = dVar25 - dVar31;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((uVar4 & 0x20) == 0) {
LAB_001f6b12:
            dVar12 = (pIVar14->ExtentsX).Min;
            dVar13 = (pIVar14->ExtentsX).Max;
            IVar28.Min = (double)(-(ulong)(dVar12 <= 0.0) & (ulong)dVar12);
            IVar28.Max = (double)(-(ulong)(0.0 <= dVar13) & (ulong)dVar13);
            pIVar14->ExtentsX = IVar28;
          }
        }
        else if ((((uVar4 & 0x20) == 0) && (pIVar8->YAxis[iVar3].Range.Min <= dVar11)) &&
                (dVar11 <= pIVar8->YAxis[iVar3].Range.Max)) goto LAB_001f6b12;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar11) < 0x7ff0000000000000) {
LAB_001f6b73:
            if ((0.0 < dVar11) || ((uVar5 & 0x20) == 0)) {
              dVar12 = pIVar14->ExtentsY[iVar3].Max;
              uVar22 = -(ulong)(dVar11 < pIVar19->Min);
              uVar21 = -(ulong)(dVar12 < dVar11);
              uVar20 = (ulong)dVar11 & uVar21;
              auVar29._0_8_ = ~uVar22 & (ulong)pIVar19->Min;
              auVar29._8_8_ = ~uVar21 & (ulong)dVar12;
              auVar10._8_4_ = (int)uVar20;
              auVar10._0_8_ = (ulong)dVar11 & uVar22;
              auVar10._12_4_ = (int)(uVar20 >> 0x20);
              *pIVar19 = (ImPlotRange)(auVar29 | auVar10);
            }
          }
        }
        else if ((((long)ABS(dVar11) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= 0.0)) &&
                (0.0 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f6b73;
        dVar11 = (double)iVar6;
        dVar25 = dVar25 + dVar31;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((0 < iVar6) || ((uVar4 & 0x20) == 0)) {
LAB_001f6bf4:
            dVar12 = (pIVar14->ExtentsX).Min;
            dVar13 = (pIVar14->ExtentsX).Max;
            uVar20 = -(ulong)(dVar11 < dVar12);
            uVar22 = -(ulong)(dVar13 < dVar11);
            auVar26._0_8_ = (ulong)dVar11 & uVar20;
            auVar26._8_8_ = (ulong)dVar11 & uVar22;
            auVar30._0_8_ = ~uVar20 & (ulong)dVar12;
            auVar30._8_8_ = ~uVar22 & (ulong)dVar13;
            pIVar14->ExtentsX = (ImPlotRange)(auVar30 | auVar26);
          }
        }
        else if (((pIVar8->YAxis[iVar3].Range.Min <= dVar25) &&
                 (dVar25 <= pIVar8->YAxis[iVar3].Range.Max)) &&
                (local_5c = (byte)((uVar4 & 0x20) >> 5), (iVar6 < 1 & local_5c) == 0))
        goto LAB_001f6bf4;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar25) < 0x7ff0000000000000) {
LAB_001f6c6a:
            if ((0.0 < dVar25) || ((uVar5 & 0x20) == 0)) {
              dVar11 = pIVar14->ExtentsY[iVar3].Max;
              uVar20 = -(ulong)(dVar25 < pIVar19->Min);
              uVar22 = -(ulong)(dVar11 < dVar25);
              auVar27._0_8_ = ~uVar20 & (ulong)pIVar19->Min;
              auVar27._8_8_ = ~uVar22 & (ulong)dVar11;
              auVar9._8_8_ = (ulong)dVar25 & uVar22;
              auVar9._0_8_ = (ulong)dVar25 & uVar20;
              *pIVar19 = (ImPlotRange)(auVar27 | auVar9);
            }
          }
        }
        else if ((((long)ABS(dVar25) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= dVar11))
                && (dVar11 <= (pIVar8->XAxis).Range.Max)) goto LAB_001f6c6a;
        dVar24 = dVar24 + 1.0;
        iVar17 = iVar17 + 1;
      } while (iVar16 != iVar17);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar14->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar14->NextItemData).Colors + 1);
    iVar16 = getter->Count;
    if (0 < iVar16) {
      bVar15 = (pIVar14->NextItemData).RenderFill;
      bVar1 = (pIVar14->NextItemData).RenderLine;
      iVar18 = 0;
      do {
        iVar2 = *(int *)((long)getter->Xs +
                        (long)(((getter->Offset + iVar18) % iVar16 + iVar16) % iVar16) *
                        (long)getter->Stride);
        if (iVar2 != 0) {
          dVar23 = (double)iVar18 + getter->YShift;
          local_38 = PlotToPixels(0.0,dVar23 - dVar31,-1);
          local_40 = PlotToPixels((double)iVar2,dVar23 + dVar31,-1);
          if ((pIVar14->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar15 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar14->NextItemData).LineWeight);
          }
          iVar16 = getter->Count;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar16);
    }
    pIVar14 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar14->NextItemData);
    pIVar14->PreviousItem = pIVar14->CurrentItem;
    pIVar14->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}